

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O2

int ly_register_types(lytype_plugin_list *plugin,char *log_name)

{
  undefined8 *puVar1;
  char *pcVar2;
  char *pcVar3;
  lytype_store_clb p_Var4;
  uint16_t uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  lytype_plugin_list *plVar9;
  uint uVar10;
  char *pcVar11;
  long lVar12;
  char *__s1;
  
  plVar9 = type_plugins;
  uVar5 = type_plugins_count;
  uVar7 = (ulong)type_plugins_count;
  uVar8 = 0;
  do {
    pcVar2 = plugin[uVar8].name;
    if (pcVar2 == (char *)0x0) {
      plVar9 = (lytype_plugin_list *)realloc(plVar9,(ulong)((int)uVar8 + (uint)uVar5) * 0x28);
      if (plVar9 == (lytype_plugin_list *)0x0) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_register_types"
              );
        iVar6 = -1;
      }
      else {
        type_plugins = plVar9;
        for (lVar12 = uVar8 * 0x28; lVar12 != 0; lVar12 = lVar12 + -0x28) {
          uVar8 = uVar7 & 0xffff;
          plVar9[uVar8].free_clb = *(_func_void_void_ptr **)((long)plugin + lVar12 + -8);
          puVar1 = (undefined8 *)((long)&plugin[-1].module + lVar12);
          pcVar2 = (char *)*puVar1;
          pcVar3 = (char *)puVar1[1];
          puVar1 = (undefined8 *)((long)plugin + lVar12 + -0x18);
          p_Var4 = (lytype_store_clb)puVar1[1];
          plVar9[uVar8].name = (char *)*puVar1;
          (&plVar9[uVar8].name)[1] = (char *)p_Var4;
          plVar9[uVar8].module = pcVar2;
          plVar9[uVar8].revision = pcVar3;
          uVar10 = (int)uVar7 + 1;
          uVar7 = (ulong)uVar10;
          type_plugins_count = (uint16_t)uVar10;
        }
        iVar6 = 0;
      }
      return iVar6;
    }
    for (lVar12 = 0; uVar7 * 0x28 != lVar12; lVar12 = lVar12 + 0x28) {
      iVar6 = strcmp(pcVar2,*(char **)((long)&plVar9->name + lVar12));
      if (iVar6 == 0) {
        pcVar3 = plugin[uVar8].module;
        iVar6 = strcmp(pcVar3,*(char **)((long)&plVar9->module + lVar12));
        if (iVar6 == 0) {
          __s1 = plugin[uVar8].revision;
          if (__s1 == (char *)0x0) {
            __s1 = "";
            pcVar11 = "";
LAB_0016a510:
            ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,
                   "Processing \"%s\" extension plugin failed,implementation collision for extension %s from module %s%s%s."
                   ,log_name,pcVar2,pcVar3,pcVar11,__s1);
            return 1;
          }
          pcVar11 = *(char **)((long)&plVar9->revision + lVar12);
          if ((pcVar11 == (char *)0x0) || (iVar6 = strcmp(__s1,pcVar11), iVar6 == 0)) {
            pcVar11 = "@";
            goto LAB_0016a510;
          }
        }
      }
    }
    uVar8 = (ulong)((int)uVar8 + 1);
  } while( true );
}

Assistant:

API int
ly_register_types(struct lytype_plugin_list *plugin, const char *log_name)
{
    struct lytype_plugin_list *p;
    uint32_t u, v;

    for (u = 0; plugin[u].name; u++) {
        /* check user type implementations for collisions */
        for (v = 0; v < type_plugins_count; v++) {
            if (!strcmp(plugin[u].name, type_plugins[v].name) &&
                    !strcmp(plugin[u].module, type_plugins[v].module) &&
                    (!plugin[u].revision || !type_plugins[v].revision || !strcmp(plugin[u].revision, type_plugins[v].revision))) {
                LOGERR(NULL, LY_ESYS, "Processing \"%s\" extension plugin failed,"
                        "implementation collision for extension %s from module %s%s%s.",
                        log_name, plugin[u].name, plugin[u].module, plugin[u].revision ? "@" : "",
                        plugin[u].revision ? plugin[u].revision : "");
                return 1;
            }
        }
    }

    /* add the new plugins, we have number of new plugins as u */
    p = realloc(type_plugins, (type_plugins_count + u) * sizeof *type_plugins);
    if (!p) {
        LOGMEM(NULL);
        return -1;
    }
    type_plugins = p;
    for (; u; u--) {
        memcpy(&type_plugins[type_plugins_count], &plugin[u - 1], sizeof *plugin);
        type_plugins_count++;
    }

    return 0;
}